

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

int QString::toIntegral_helper<int>(QStringView string,bool *ok,int base)

{
  long lVar1;
  
  lVar1 = QString::toIntegral_helper(string,ok,base);
  if ((int)lVar1 != lVar1) {
    if (ok != (bool *)0x0) {
      *ok = false;
    }
    lVar1 = 0;
  }
  return (int)lVar1;
}

Assistant:

static
    T toIntegral_helper(QStringView string, bool *ok, int base)
    {
        using Int64 = typename std::conditional<std::is_unsigned<T>::value, qulonglong, qlonglong>::type;
        using Int32 = typename std::conditional<std::is_unsigned<T>::value, uint, int>::type;

        // we select the right overload by casting base to int or uint
        Int64 val = toIntegral_helper(string, ok, Int32(base));
        if (T(val) != val) {
            if (ok)
                *ok = false;
            val = 0;
        }
        return T(val);
    }